

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_emu_d3d56.cc
# Opt level: O0

void __thiscall
hwtest::pgraph::MthdEmuEmuD3D0Config::~MthdEmuEmuD3D0Config(MthdEmuEmuD3D0Config *this)

{
  MthdEmuEmuD3D0Config *this_local;
  
  ~MthdEmuEmuD3D0Config(this);
  operator_delete(this);
  return;
}

Assistant:

void adjust_orig_mthd() override {
		if (rnd() & 1) {
			if (rnd() & 3)
				insrt(val, 0, 4, 1);
			if (rnd() & 1) {
				val ^= 1 << (rnd() & 0x1f);
			}
			if (rnd() & 1) {
				val ^= 1 << (rnd() & 0x1f);
			}
		}
		adjust_orig_icmd(&orig);
	}